

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameReloadSchema(Parse *pParse,int iDb)

{
  if (pParse->pVdbe != (Vdbe *)0x0) {
    sqlite3VdbeAddOp3(pParse->pVdbe,0x5f,iDb,1,(pParse->db->aDb[iDb].pSchema)->schema_cookie + 1);
    sqlite3VdbeAddParseSchemaOp(pParse->pVdbe,iDb,(char *)0x0);
    if (iDb != 1) {
      sqlite3VdbeAddParseSchemaOp(pParse->pVdbe,1,(char *)0x0);
      return;
    }
  }
  return;
}

Assistant:

static void renameReloadSchema(Parse *pParse, int iDb){
  Vdbe *v = pParse->pVdbe;
  if( v ){
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddParseSchemaOp(pParse->pVdbe, iDb, 0);
    if( iDb!=1 ) sqlite3VdbeAddParseSchemaOp(pParse->pVdbe, 1, 0);
  }
}